

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

bool __thiscall
TPZFMatrix<long_double>::Compare(TPZFMatrix<long_double> *this,TPZSavable *copy,bool override)

{
  longdouble lVar1;
  longdouble lVar2;
  bool bVar3;
  TPZFMatrix<long_double> *A;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  stringstream sout;
  longdouble local_1dc;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  if (copy != (TPZSavable *)0x0) {
    A = (TPZFMatrix<long_double> *)__dynamic_cast(copy,&TPZSavable::typeinfo,&typeinfo,0);
    if (A == (TPZFMatrix<long_double> *)0x0) {
      return false;
    }
    lVar6 = 0;
    bVar3 = TPZMatrix<long_double>::Compare(&this->super_TPZMatrix<long_double>,copy,false);
    lVar5 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol *
            (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
    if (lVar5 < 1) {
      lVar5 = lVar6;
    }
    local_1dc = (longdouble)0;
    while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
      lVar1 = *(longdouble *)((long)this->fElem + lVar6);
      lVar2 = *(longdouble *)((long)A->fElem + lVar6);
      bVar3 = (bool)(bVar3 & lVar1 == lVar2);
      local_1dc = local_1dc + ABS(lVar1 - lVar2);
      lVar6 = lVar6 + 0x10;
    }
    if (bVar3 != false) {
      return true;
    }
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar4 = std::operator<<(local_1a0,
                             "virtual bool TPZFMatrix<long double>::Compare(TPZSavable *, bool) [TVar = long double]"
                            );
    std::operator<<(poVar4," did not compare ");
    poVar4 = std::operator<<(local_1a0," number different terms ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," number terms ");
    std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(local_1a0," difference in norm L1 ");
    std::ostream::_M_insert<long_double>(local_1dc);
    std::__cxx11::stringbuf::str();
    poVar4 = std::operator<<((ostream *)&std::cout,local_1d0);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
    if (override) {
      operator=(this,A);
    }
  }
  return false;
}

Assistant:

bool TPZFMatrix<TVar>::Compare(TPZSavable *copy, bool override)
{
    TPZFMatrix<TVar> *fmat = dynamic_cast<TPZFMatrix<TVar> *> (copy);
    if(!fmat) return false;
    
    bool matresult = TPZMatrix<TVar>::Compare(copy,false);
    int64_t nel = this->fRow*this->fCol;
    TVar diff=0.;
    int64_t numdif = 0;
    int64_t iel;
    for(iel=0; iel<nel; iel++)
    {
        if(fElem[iel] != fmat->fElem[iel])
        {
            matresult = false;
            numdif++;
        }
        TVar exp = fElem[iel]-fmat->fElem[iel];
        diff += fabs(exp);
    }
    if(!matresult)
    {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << " did not compare ";
        sout << " number different terms " << numdif << " number terms " << this->fRow*this->fCol;
        sout << " difference in norm L1 " << diff;
        LOGPZ_ERROR(loggerCheck,sout.str())
    }
    if(!matresult && override)
    {
        this->operator=(*fmat);
    }
    return matresult;
}